

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

size_t __thiscall
ContextSpecificHolder<Extensions,_(unsigned_char)'\xa3',_(OptionType)1>::EncodedSize
          (ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *this)

{
  size_t size;
  size_t sVar1;
  size_t innerSize;
  ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *this_local;
  
  size = DerBase::EncodedSize((DerBase *)this);
  if (size < 3) {
    this_local = (ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *)0x0;
  }
  else {
    sVar1 = GetSizeBytes(size);
    this_local = (ContextSpecificHolder<Extensions,_(unsigned_char)__xa3_,_(OptionType)1> *)
                 (sVar1 + 1 + size);
  }
  return (size_t)this_local;
}

Assistant:

size_t EncodedSize()
	{
		size_t innerSize = innerType.EncodedSize();

        // if innerType decodes to null, then this isn't present
        // Mirror the logic in Encode
        if (innerSize <= 2)
            return 0;

		return 1 + GetSizeBytes(innerSize) + innerSize;
	}